

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  uint uVar1;
  uint64_t in_RDX;
  uint16_t *in_RSI;
  uint64_t *in_RDI;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    _scalar_bitset_set_list(in_RDI,in_RSI,in_RDX);
  }
  else {
    _asm_bitset_set_list(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}